

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.h
# Opt level: O0

string * __thiscall
Catch::AssertionResult::getExpression_abi_cxx11_
          (string *__return_storage_ptr__,AssertionResult *this)

{
  bool bVar1;
  AssertionResult *this_local;
  string *expr;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  StringRef::size(&(this->m_info).capturedExpression);
  std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
  bVar1 = isFalseTest((this->m_info).resultDisposition);
  if (bVar1) {
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"!(");
  }
  operator+=(__return_storage_ptr__,&(this->m_info).capturedExpression);
  bVar1 = isFalseTest((this->m_info).resultDisposition);
  if (bVar1) {
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,')');
  }
  return __return_storage_ptr__;
}

Assistant:

std::string AssertionResult::getExpression() const {
        // Possibly overallocating by 3 characters should be basically free
        std::string expr; expr.reserve(m_info.capturedExpression.size() + 3);
        if (isFalseTest(m_info.resultDisposition)) {
            expr += "!(";
        }
        expr += m_info.capturedExpression;
        if (isFalseTest(m_info.resultDisposition)) {
            expr += ')';
        }
        return expr;
    }